

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Random_keys.cpp
# Opt level: O3

void __thiscall
Random_keys::mutacaoAdaptavitva(Random_keys *this,RK_Individual *ind,float pctTam,float pctChance)

{
  int iVar1;
  ulong uVar2;
  float fVar3;
  float fVar4;
  
  fVar3 = roundf(pctTam * (float)ind->number_of_edges);
  fVar4 = roundf(pctChance * 100.0);
  iVar1 = rand();
  if ((iVar1 % 100 <= (int)fVar4) && (0 < (int)fVar3)) {
    uVar2 = 0;
    do {
      rand();
      iVar1 = rand();
      ind->weights[uVar2] = (double)(iVar1 % 100);
      uVar2 = uVar2 + 1;
    } while ((uint)(int)fVar3 != uVar2);
  }
  return;
}

Assistant:

void Random_keys::mutacaoAdaptavitva(RK_Individual *ind, float pctTam, float pctChance) {

    int tam = round(pctTam* ind->getNumEdges());
    int n = round(pctChance*100);
    int m = rand() % 100;

    if(m<=n){
        for(int i=0; i<tam; i++){
            int j = rand() % ind->getNumEdges();

            ind->getWeights()[i] = rand() % RANGEPESO;
        }
    }
}